

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# micro_string_test.cc
# Opt level: O3

void __thiscall
google::protobuf::internal::anon_unknown_0::MicroStringPrevTest_SetNullView_Test::TestBody
          (MicroStringPrevTest_SetNullView_Test *this)

{
  MicroString *this_00;
  ParamType *pPVar1;
  size_t sVar2;
  time_t tVar3;
  MicroString MVar4;
  Arena *arena;
  size_t size;
  char *pcVar5;
  Arena *arena_00;
  string_view data;
  size_t self_used;
  size_t used;
  AssertHelper local_60;
  MicroString local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_50;
  string_view local_48;
  size_t local_38;
  size_t local_30;
  
  local_30 = MicroStringPrevTest::arena_space_used(&this->super_MicroStringPrevTest);
  this_00 = &(this->super_MicroStringPrevTest).str_;
  local_38 = MicroString::SpaceUsedExcludingSelfLong(this_00);
  pPVar1 = testing::
           WithParamInterface<std::tuple<bool,_google::protobuf::internal::(anonymous_namespace)::PreviousState>_>
           ::GetParam();
  arena_00 = &(this->super_MicroStringPrevTest).arena_;
  if (((ulong)(this->super_MicroStringPrevTest).str_.rep_ & 3) == 0) {
    this_00->rep_ = (void *)0x0;
  }
  else {
    arena = (Arena *)0x0;
    if ((pPVar1->
        super__Tuple_impl<0UL,_bool,_google::protobuf::internal::(anonymous_namespace)::PreviousState>
        ).super__Head_base<0UL,_bool,_false>._M_head_impl != false) {
      arena = arena_00;
    }
    MicroString::SetImpl(this_00,(string_view)ZEXT816(0),arena,7);
  }
  local_48 = MicroString::Get(this_00);
  pcVar5 = anon_var_dwarf_a22956 + 5;
  testing::internal::CmpHelperEQ<std::basic_string_view<char,std::char_traits<char>>,char[1]>
            ((internal *)&local_58,"str_.Get()","\"\"",&local_48,
             (char (*) [1])(anon_var_dwarf_a22956 + 5));
  if (local_58.rep_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_48);
    if (local_50 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = (local_50->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/micro_string_test.cc"
               ,0x184,pcVar5);
    testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    if ((long *)local_48._M_len != (long *)0x0) {
      (**(code **)(*(long *)local_48._M_len + 8))();
    }
  }
  if (local_50 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_50,local_50);
  }
  sVar2 = MicroStringPrevTest::arena_space_used(&this->super_MicroStringPrevTest);
  local_48._M_len = sVar2;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&local_58,"used","arena_space_used()",&local_30,&local_48._M_len);
  if (local_58.rep_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_48);
    if (local_50 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = anon_var_dwarf_a22956 + 5;
    }
    else {
      pcVar5 = (local_50->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/micro_string_test.cc"
               ,0x185,pcVar5);
    testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    if ((long *)local_48._M_len != (long *)0x0) {
      (**(code **)(*(long *)local_48._M_len + 8))();
    }
  }
  if (local_50 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_50,local_50);
  }
  sVar2 = MicroString::SpaceUsedExcludingSelfLong(this_00);
  local_48._M_len = sVar2;
  testing::internal::CmpHelperGE<unsigned_long,unsigned_long>
            ((internal *)&local_58,"self_used","str_.SpaceUsedExcludingSelfLong()",&local_38,
             &local_48._M_len);
  if (local_58.rep_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_48);
    if (local_50 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = anon_var_dwarf_a22956 + 5;
    }
    else {
      pcVar5 = (local_50->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/micro_string_test.cc"
               ,0x186,pcVar5);
    testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    if ((long *)local_48._M_len != (long *)0x0) {
      (**(code **)(*(long *)local_48._M_len + 8))();
    }
  }
  if (local_50 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_50,local_50);
  }
  tVar3 = time((time_t *)0x0);
  pPVar1 = testing::
           WithParamInterface<std::tuple<bool,_google::protobuf::internal::(anonymous_namespace)::PreviousState>_>
           ::GetParam();
  if (((ulong)this_00->rep_ & 3) == 0) {
    local_58.rep_ = (void *)((ulong)(tVar3 == 0) << 2);
    if (tVar3 == 0) {
      pcVar5 = MicroString::inline_head(&local_58);
      memcpy(pcVar5,(void *)0x0,(ulong)(tVar3 == 0));
      MVar4.rep_ = local_58.rep_;
    }
    else {
      MVar4.rep_ = (void *)0x0;
    }
    this_00->rep_ = MVar4.rep_;
  }
  else {
    if ((pPVar1->
        super__Tuple_impl<0UL,_bool,_google::protobuf::internal::(anonymous_namespace)::PreviousState>
        ).super__Head_base<0UL,_bool,_false>._M_head_impl == false) {
      arena_00 = (Arena *)0x0;
    }
    data._M_str = (char *)0x0;
    data._M_len = (ulong)(tVar3 == 0);
    MicroString::SetImpl(this_00,data,arena_00,7);
  }
  local_48 = MicroString::Get(this_00);
  pcVar5 = anon_var_dwarf_a22956 + 5;
  testing::internal::CmpHelperEQ<std::basic_string_view<char,std::char_traits<char>>,char[1]>
            ((internal *)&local_58,"str_.Get()","\"\"",&local_48,
             (char (*) [1])(anon_var_dwarf_a22956 + 5));
  if (local_58.rep_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_48);
    if (local_50 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = (local_50->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/micro_string_test.cc"
               ,0x18b,pcVar5);
    testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    if ((long *)local_48._M_len != (long *)0x0) {
      (**(code **)(*(long *)local_48._M_len + 8))();
    }
  }
  if (local_50 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_50,local_50);
  }
  sVar2 = MicroStringPrevTest::arena_space_used(&this->super_MicroStringPrevTest);
  local_48._M_len = sVar2;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&local_58,"used","arena_space_used()",&local_30,&local_48._M_len);
  if (local_58.rep_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_48);
    if (local_50 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = anon_var_dwarf_a22956 + 5;
    }
    else {
      pcVar5 = (local_50->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/micro_string_test.cc"
               ,0x18c,pcVar5);
    testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    if ((long *)local_48._M_len != (long *)0x0) {
      (**(code **)(*(long *)local_48._M_len + 8))();
    }
  }
  if (local_50 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_50,local_50);
  }
  sVar2 = MicroString::SpaceUsedExcludingSelfLong(this_00);
  local_48._M_len = sVar2;
  testing::internal::CmpHelperGE<unsigned_long,unsigned_long>
            ((internal *)&local_58,"self_used","str_.SpaceUsedExcludingSelfLong()",&local_38,
             &local_48._M_len);
  if (local_58.rep_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_48);
    if (local_50 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = anon_var_dwarf_a22956 + 5;
    }
    else {
      pcVar5 = (local_50->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/micro_string_test.cc"
               ,0x18d,pcVar5);
    testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    if ((long *)local_48._M_len != (long *)0x0) {
      (**(code **)(*(long *)local_48._M_len + 8))();
    }
  }
  if (local_50 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_50,local_50);
  }
  return;
}

Assistant:

TEST_P(MicroStringPrevTest, SetNullView) {
  const size_t used = arena_space_used();
  const size_t self_used = str_.SpaceUsedExcludingSelfLong();
  str_.Set(absl::string_view(), arena());
  EXPECT_EQ(str_.Get(), "");
  EXPECT_EQ(used, arena_space_used());
  EXPECT_GE(self_used, str_.SpaceUsedExcludingSelfLong());

  // Again but with a non-constant size to avoid the CONSTANT_P path.
  size_t zero = time(nullptr) == 0;
  str_.Set(absl::string_view(nullptr, zero), arena());
  EXPECT_EQ(str_.Get(), "");
  EXPECT_EQ(used, arena_space_used());
  EXPECT_GE(self_used, str_.SpaceUsedExcludingSelfLong());
}